

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  double *pdVar12;
  double *pdVar13;
  uint uVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  ulong uVar20;
  double *pdVar21;
  int i;
  ulong uVar22;
  long lVar23;
  double oneOverScaleFactor;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar27 [16];
  undefined1 auVar26 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  double dVar30;
  undefined1 auVar31 [32];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int local_c4;
  long local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a0;
  double *local_98;
  
  iVar4 = this->kCategoryCount;
  if (0 < (long)iVar4) {
    uVar5 = this->kStateCount;
    iVar6 = this->kPartialsPaddedStateCount;
    iVar7 = this->kPatternCount;
    iVar8 = this->kMatrixSize;
    local_c0 = 0;
    uVar14 = uVar5 + 1;
    uVar11 = uVar5 + 3;
    if (-1 < (int)uVar5) {
      uVar11 = uVar5;
    }
    local_c4 = iVar6 * startPattern;
    local_98 = matrices2 + 2;
    local_a0 = matrices1 + 2;
    local_b8 = matrices1;
    local_b0 = matrices2;
    do {
      if (startPattern < endPattern) {
        pdVar17 = partials1 + local_c4;
        pdVar12 = partials2 + local_c4;
        pdVar19 = destP + (iVar7 * (int)local_c0 + startPattern) * iVar6;
        lVar16 = (long)startPattern;
        do {
          if (0 < (int)uVar5) {
            uVar22 = 0;
            dVar1 = scaleFactors[lVar16];
            pdVar13 = local_b8;
            pdVar15 = local_98;
            pdVar18 = local_a0;
            pdVar21 = local_b0;
            do {
              auVar26 = ZEXT864(0) << 0x40;
              auVar25 = ZEXT832(0) << 0x40;
              uVar20 = 0;
              if (3 < (int)uVar5) {
                do {
                  auVar28._16_16_ = *(undefined1 (*) [16])(pdVar15 + (uVar20 - 2));
                  auVar28._0_16_ = *(undefined1 (*) [16])(pdVar18 + (uVar20 - 2));
                  auVar31._16_16_ = *(undefined1 (*) [16])(pdVar12 + uVar20);
                  auVar31._0_16_ = *(undefined1 (*) [16])(pdVar17 + uVar20);
                  auVar24 = vfmadd213pd_fma(auVar31,auVar28,auVar26._0_32_);
                  auVar29._16_16_ = *(undefined1 (*) [16])(pdVar15 + uVar20);
                  auVar29._0_16_ = *(undefined1 (*) [16])(pdVar18 + uVar20);
                  auVar25._16_16_ = *(undefined1 (*) [16])(pdVar12 + uVar20 + 2);
                  auVar25._0_16_ = *(undefined1 (*) [16])(pdVar17 + uVar20 + 2);
                  uVar20 = uVar20 + 4;
                  auVar24 = vfmadd213pd_fma(auVar25,auVar29,ZEXT1632(auVar24));
                  auVar26 = ZEXT1664(auVar24);
                  auVar25 = ZEXT1632(auVar24);
                } while ((long)uVar20 < (long)(int)(uVar11 & 0xfffffffc));
              }
              auVar24 = auVar25._0_16_;
              auVar27 = auVar25._16_16_;
              dVar30 = auVar25._0_8_;
              dVar32 = auVar25._16_8_;
              if ((int)uVar20 < (int)uVar5) {
                uVar20 = uVar20 & 0xffffffff;
                lVar23 = 0;
                auVar9 = auVar24;
                auVar10 = auVar27;
                do {
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = pdVar13[uVar20 + lVar23];
                  auVar34._8_8_ = 0;
                  auVar34._0_8_ = pdVar21[uVar20 + lVar23];
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = pdVar17[uVar20 + lVar23];
                  auVar9 = vfmadd231sd_fma(auVar9,auVar33,auVar2);
                  dVar30 = auVar9._0_8_;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = pdVar12[uVar20 + lVar23];
                  auVar10 = vfmadd231sd_fma(auVar10,auVar34,auVar3);
                  dVar32 = auVar10._0_8_;
                  lVar23 = lVar23 + 1;
                } while (uVar5 - uVar20 != lVar23);
              }
              auVar24 = vshufpd_avx(auVar24,auVar24,1);
              auVar27 = vshufpd_avx(auVar27,auVar27,1);
              uVar22 = uVar22 + 1;
              pdVar15 = pdVar15 + uVar14;
              pdVar18 = pdVar18 + uVar14;
              pdVar21 = pdVar21 + uVar14;
              pdVar13 = pdVar13 + uVar14;
              *pdVar19 = (1.0 / dVar1) * (auVar24._0_8_ + dVar30) * (auVar27._0_8_ + dVar32);
              pdVar19 = pdVar19 + 1;
            } while (uVar22 != uVar5);
          }
          lVar16 = lVar16 + 1;
          pdVar12 = pdVar12 + iVar6;
          pdVar17 = pdVar17 + iVar6;
        } while (lVar16 != endPattern);
      }
      local_c4 = local_c4 + iVar7 * iVar6;
      local_98 = local_98 + iVar8;
      local_a0 = local_a0 + iVar8;
      local_b0 = local_b0 + iVar8;
      local_b8 = local_b8 + iVar8;
      local_c0 = local_c0 + 1;
    } while (local_c0 != iVar4);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                         const REALTYPE* partials1,
                                                                         const REALTYPE* matrices1,
                                                                         const REALTYPE* partials2,
                                                                         const REALTYPE* matrices2,
                                                                         const REALTYPE* scaleFactors,
                                                                         int startPattern,
                                                                         int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE oneOverScaleFactor = REALTYPE(1.0) / scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B) * oneOverScaleFactor;
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}